

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O2

void * xmlMallocLoc(size_t size,char *file,int line)

{
  xmlGenericErrorFunc *pp_Var1;
  void **ppvVar2;
  undefined8 *puVar3;
  char *pcVar4;
  void *pvVar5;
  xmlGenericErrorFunc p_Var6;
  uint uVar7;
  
  if (xmlMemInitialized == '\0') {
    xmlInitMemory();
  }
  if (size < 0xffffffffffffffd8) {
    puVar3 = (undefined8 *)malloc(size + 0x28);
    if (puVar3 != (undefined8 *)0x0) {
      *puVar3 = 0x100005aa5;
      puVar3[2] = size;
      puVar3[3] = file;
      *(int *)(puVar3 + 4) = line;
      xmlMutexLock(xmlMemMutex);
      uVar7 = block + 1;
      block = uVar7;
      puVar3[1] = (ulong)uVar7;
      debugMemBlocks = debugMemBlocks + 1;
      debugMemSize = debugMemSize + size;
      if (debugMaxMemSize < debugMemSize) {
        debugMaxMemSize = debugMemSize;
      }
      xmlMutexUnlock(xmlMemMutex);
      if (uVar7 == xmlMemStopAtBlock) {
        xmlMallocBreakpoint();
      }
      puVar3 = puVar3 + 5;
      if ((undefined8 *)xmlMemTraceBlockAt != puVar3) {
        return puVar3;
      }
      pp_Var1 = __xmlGenericError();
      p_Var6 = *pp_Var1;
      ppvVar2 = __xmlGenericErrorContext();
      (*p_Var6)(*ppvVar2,"%p : Malloc(%lu) Ok\n",xmlMemTraceBlockAt,size);
      xmlMallocBreakpoint();
      return puVar3;
    }
    pp_Var1 = __xmlGenericError();
    p_Var6 = *pp_Var1;
    ppvVar2 = __xmlGenericErrorContext();
    pvVar5 = *ppvVar2;
    pcVar4 = "xmlMallocLoc : Out of free space\n";
  }
  else {
    pp_Var1 = __xmlGenericError();
    p_Var6 = *pp_Var1;
    ppvVar2 = __xmlGenericErrorContext();
    pvVar5 = *ppvVar2;
    pcVar4 = "xmlMallocLoc : Unsigned overflow\n";
  }
  (*p_Var6)(pvVar5,pcVar4);
  return (void *)0x0;
}

Assistant:

void *
xmlMallocLoc(size_t size, const char * file, int line)
{
    MEMHDR *p;
    void *ret;

    if (!xmlMemInitialized) xmlInitMemory();
#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Malloc(%d)\n",size);
#endif

    TEST_POINT

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMallocLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    p = (MEMHDR *) malloc(RESERVE_SIZE+size);

    if (!p) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMallocLoc : Out of free space\n");
	xmlMemoryDump();
	return(NULL);
    }
    p->mh_tag = MEMTAG;
    p->mh_size = size;
    p->mh_type = MALLOC_TYPE;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    p->mh_number = ++block;
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Malloc(%d) Ok\n",size);
#endif

    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();

    ret = HDR_2_CLIENT(p);

    if (xmlMemTraceBlockAt == ret) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Malloc(%lu) Ok\n", xmlMemTraceBlockAt,
			(long unsigned)size);
	xmlMallocBreakpoint();
    }

    TEST_POINT

    return(ret);
}